

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_registry.hxx
# Opt level: O0

void cryptox::test::test_vector_registry<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>_>::
     test_vector(string *input,string *expected)

{
  undefined8 uVar1;
  bool bVar2;
  iterator d_first;
  lazy_ostream *prev;
  cryptox local_d8 [32];
  basic_cstring<const_char> local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a8;
  basic_cstring<const_char> local_80;
  basic_cstring<const_char> local_70 [2];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>_> local_40;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>_> digester;
  digest_type actual;
  string *expected_local;
  string *input_local;
  
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>_>::
  basic_message_digester(&local_40);
  local_48._M_current = (char *)std::__cxx11::string::begin();
  local_50._M_current = (char *)std::__cxx11::string::end();
  d_first = std::array<unsigned_char,_28UL>::begin
                      ((array<unsigned_char,_28UL> *)
                       ((long)&digester.
                               super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
                               ._context + 4));
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,224ul>>::operator()
            ((basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,224ul>> *)
             &local_40,local_48,local_50,d_first);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
               ,0x7e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_70,0x2a,&local_80);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a8,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
               ,0x7e);
    to_hex<std::array<unsigned_char,28ul>>
              (local_d8,(array<unsigned_char,_28UL> *)
                        ((long)&digester.
                                super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
                                ._context + 4));
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_a8,&local_b8,0x2a,1,2,local_d8,"to_hex(actual)",expected,"expected");
    std::__cxx11::string::~string((string *)local_d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>_>::
  ~basic_message_digester(&local_40);
  return;
}

Assistant:

static void test_vector(const std::string& input,
		                        const std::string& expected) {

			typename Algorithm::digest_type actual;

			basic_message_digester<Algorithm> digester;
			digester(input.begin(), input.end(), actual.begin());

			BOOST_CHECK_EQUAL(to_hex(actual), expected);
		}